

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shuff.hpp
# Opt level: O0

void shuff_build_codes(bit_io_t *bio,uint64_t *syms,uint64_t *freq,uint64_t n)

{
  size_t in_RCX;
  uint64_t *in_RDX;
  uint64_t *in_RSI;
  uint64_t cw_lens [64];
  uint64_t max_codeword_length;
  uint64_t *p;
  uint64_t i;
  uint64_t in_stack_fffffffffffffdc8;
  bit_io_t *in_stack_fffffffffffffdd0;
  uint64_t in_stack_fffffffffffffe30;
  uint64_t *in_stack_fffffffffffffe38;
  bit_io_t *in_stack_fffffffffffffe40;
  uint64_t in_stack_ffffffffffffff18;
  uint64_t *in_stack_ffffffffffffff20;
  uint64_t *in_stack_ffffffffffffff28;
  uint64_t *in_stack_ffffffffffffff30;
  ulong local_38;
  uint64_t *local_30;
  ulong local_28;
  
  shuff_indirect_sort(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                      in_stack_ffffffffffffff18);
  shuff_calculate_minimum_redundancy(in_RDX,in_RSI,in_RCX);
  for (local_28 = 0; local_28 < 0x40; local_28 = local_28 + 1) {
    *(undefined8 *)(&stack0xfffffffffffffdc8 + local_28 * 8) = 0;
  }
  local_38 = 0;
  for (local_30 = in_RSI; local_30 < in_RSI + in_RCX; local_30 = local_30 + 1) {
    if (local_38 < in_RDX[*local_30]) {
      local_38 = in_RDX[*local_30];
    }
    *(long *)(&stack0xfffffffffffffdc8 + in_RDX[*local_30] * 8) =
         *(long *)(&stack0xfffffffffffffdc8 + in_RDX[*local_30] * 8) + 1;
  }
  shuff_build_canonical_arrays((uint64_t *)&stack0xfffffffffffffdc8,local_38);
  SHUFF_OUTPUT_ULONG(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,'\0');
  SHUFF_OUTPUT_ULONG(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,'\0');
  qsort(in_RSI,in_RCX,8,shuff_pcmp);
  for (local_30 = in_RSI; local_30 < in_RSI + in_RCX; local_30 = local_30 + 1) {
    SHUFF_OUTPUT_UNARY_CODE(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  }
  shuff_interp_encode(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30)
  ;
  shuff_generate_mapping((uint64_t *)&stack0xfffffffffffffdc8,in_RSI,in_RDX,local_38,in_RCX);
  return;
}

Assistant:

void shuff_build_codes(
    bit_io_t* bio, uint64_t* syms, uint64_t* freq, uint64_t n)
{
    uint64_t i;
    const uint64_t* p;
    uint64_t max_codeword_length; //, min_codeword_length;
    uint64_t cw_lens[SHUFF_L + 1];

    shuff_indirect_sort(freq, syms, syms, n);

    shuff_calculate_minimum_redundancy(freq, syms, n);

    // calculcate max_codeword_length and set cw_lens[]
    for (i = 0; i <= SHUFF_L; i++)
        cw_lens[i] = 0;
    // min_codeword_length = max_codeword_length = freq[syms[0]];
    max_codeword_length = 0;
    for (p = syms; p < syms + n; p++) {
        if (freq[*p] > max_codeword_length)
            max_codeword_length = freq[*p];
        cw_lens[freq[*p]]++;
    }

    shuff_build_canonical_arrays(cw_lens, max_codeword_length);

    SHUFF_OUTPUT_ULONG(bio, n, SHUFF_LOG2_MAX_SYMBOL);
    SHUFF_OUTPUT_ULONG(bio, max_codeword_length, SHUFF_LOG2_L);

    qsort(syms, n, sizeof(uint64_t), shuff_pcmp);

    for (p = syms; p < syms + n; p++) {
        SHUFF_OUTPUT_UNARY_CODE(bio, max_codeword_length - freq[*p]);
    }

    shuff_interp_encode(bio, syms, n);

    shuff_generate_mapping(cw_lens, syms, freq, max_codeword_length, n);
}